

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_tile_int8
               (Mat *kernel,Mat *A,int inch,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int local_7c;
  short z5;
  short z4;
  short z3;
  short z2;
  short z1;
  short z0;
  short r2_1;
  short r1_1;
  short r0_1;
  int m_1;
  char r2;
  char r1;
  char r0;
  int m;
  char *k0;
  short tmp [6] [3];
  int kk;
  int ii;
  short *ptmp;
  int k_local;
  int max_ii_local;
  int i_local;
  int inch_local;
  Mat *A_local;
  
  tmp._24_8_ = A->data;
  tmp[3][1] = 0;
  tmp[3][2] = 0;
  for (; (int)tmp[3]._2_4_ < max_ii; tmp[3]._2_4_ = tmp[3]._2_4_ + 1) {
    tmp[2][2] = 0;
    tmp[3][0] = 0;
    for (; (int)tmp._16_4_ < max_kk; tmp._16_4_ = tmp._16_4_ + 1) {
      _z2 = (char *)((long)kernel->data +
                    (long)((k + tmp._16_4_) * 9) + (long)((i + tmp[3]._2_4_) * inch * 9));
      for (_z4 = 0; _z4 < 3; _z4 = _z4 + 1) {
        cVar1 = *_z2;
        cVar2 = _z2[1];
        cVar3 = _z2[2];
        (&r1_1)[_z4] = cVar1 * 6;
        *(short *)((long)&m_1 + (long)_z4 * 2 + 2) = cVar1 * -4 + cVar2 * -4 + cVar3 * -4;
        *(short *)((long)&m + (long)_z4 * 2) = cVar1 * -4 + cVar2 * 4 + cVar3 * -4;
        tmp[-1][_z4] = (short)cVar1 + cVar2 * 2 + cVar3 * 4;
        tmp[0][_z4] = (short)cVar1 + cVar2 * -2 + cVar3 * 4;
        tmp[1][_z4] = cVar3 * 6;
        _z2 = _z2 + 3;
      }
      for (local_7c = 0; local_7c < 6; local_7c = local_7c + 1) {
        sVar4 = (&r1_1)[(long)local_7c * 3];
        sVar5 = (&r0_1)[(long)local_7c * 3];
        sVar6 = *(short *)((long)&m_1 + (long)local_7c * 6);
        *(short *)tmp._24_8_ = sVar4 * 6;
        *(short *)(tmp._24_8_ + 2) = sVar4 * -4 + sVar5 * -4 + sVar6 * -4;
        *(short *)(tmp._24_8_ + 4) = sVar4 * -4 + sVar5 * 4 + sVar6 * -4;
        *(short *)(tmp._24_8_ + 6) = sVar4 + sVar5 * 2 + sVar6 * 4;
        *(short *)(tmp._24_8_ + 8) = sVar4 + sVar5 * -2 + sVar6 * 4;
        *(short *)(tmp._24_8_ + 10) = sVar6 * 6;
        tmp._24_8_ = tmp._24_8_ + 0xc;
      }
    }
  }
  return;
}

Assistant:

static inline void conv3x3s1_winograd43_transform_kernel_tile_int8(const Mat& kernel, Mat& A, int inch, int i, int max_ii, int k, int max_kk)
{
    // const short ktm[6][3] = {
    //     {6, 0, 0},
    //     {-4, -4, -4},
    //     {-4, 4, -4},
    //     {1, 2, 4},
    //     {1, -2, 4},
    //     {0, 0, 6}
    // };

    short* ptmp = A;

    int ii = 0;
    for (; ii < max_ii; ii++)
    {
        int kk = 0;
        for (; kk < max_kk; kk++)
        {
            short tmp[6][3];

            const signed char* k0 = (const signed char*)kernel + (i + ii) * inch * 9 + (k + kk) * 9;

            for (int m = 0; m < 3; m++)
            {
                signed char r0 = k0[0];
                signed char r1 = k0[1];
                signed char r2 = k0[2];

                tmp[0][m] = r0 * 6;
                tmp[1][m] = -r0 * 4 - r1 * 4 - r2 * 4;
                tmp[2][m] = -r0 * 4 + r1 * 4 - r2 * 4;
                tmp[3][m] = r0 + r1 * 2 + r2 * 4;
                tmp[4][m] = r0 - r1 * 2 + r2 * 4;
                tmp[5][m] = r2 * 6;

                k0 += 3;
            }

            for (int m = 0; m < 6; m++)
            {
                short r0 = tmp[m][0];
                short r1 = tmp[m][1];
                short r2 = tmp[m][2];

                short z0 = r0 * 6;
                short z1 = -r0 * 4 - r1 * 4 - r2 * 4;
                short z2 = -r0 * 4 + r1 * 4 - r2 * 4;
                short z3 = r0 + r1 * 2 + r2 * 4;
                short z4 = r0 - r1 * 2 + r2 * 4;
                short z5 = r2 * 6;

                ptmp[0] = z0;
                ptmp[1] = z1;
                ptmp[2] = z2;
                ptmp[3] = z3;
                ptmp[4] = z4;
                ptmp[5] = z5;
                ptmp += 6;
            }
        }
    }
}